

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDTypes.cpp
# Opt level: O3

bool __thiscall SWDParser::IsLineReset(SWDParser *this,SWDLineReset *reset)

{
  pointer *ppSVar1;
  SWDBit *pSVar2;
  undefined8 uVar3;
  vector<SWDBit,std::allocator<SWDBit>> *pvVar4;
  pointer pSVar5;
  long lVar6;
  iterator iVar7;
  ulong uVar8;
  bool bVar9;
  SWDBit local_98;
  vector<SWDBit,std::allocator<SWDBit>> *local_68;
  SWDLineReset *local_60;
  SWDBit local_58;
  
  pSVar5 = (reset->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((reset->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar5) {
    (reset->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar5;
  }
  local_68 = (vector<SWDBit,std::allocator<SWDBit>> *)&this->mBitsBuffer;
  pSVar5 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = 0;
  bVar9 = false;
  uVar8 = 0;
  local_60 = reset;
  while( true ) {
    if ((ulong)(((long)(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 3) *
               -0x3333333333333333) <= uVar8) {
      ParseBit(&local_98,this);
      pvVar4 = local_68;
      iVar7._M_current =
           (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SWDBit,_std::allocator<SWDBit>_>::_M_realloc_insert<SWDBit>
                  ((vector<SWDBit,_std::allocator<SWDBit>_> *)local_68,iVar7,&local_98);
      }
      else {
        (iVar7._M_current)->low_end = local_98.low_end;
        (iVar7._M_current)->rising = local_98.rising;
        (iVar7._M_current)->falling = local_98.falling;
        (iVar7._M_current)->state_rising = local_98.state_rising;
        (iVar7._M_current)->state_falling = local_98.state_falling;
        (iVar7._M_current)->low_start = local_98.low_start;
        ppSVar1 = &(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      pSVar5 = *(pointer *)pvVar4;
    }
    if (*(int *)((long)&pSVar5->state_rising + lVar6) != 1) break;
    bVar9 = 0x30 < uVar8;
    uVar8 = uVar8 + 1;
    lVar6 = lVar6 + 0x28;
    if (uVar8 == 0x32) {
      ParseBit(&local_58,this);
      pvVar4 = local_68;
      local_98.low_end = local_58.low_end;
      local_98.rising = local_58.rising;
      local_98.falling = local_58.falling;
      local_98.state_rising = local_58.state_rising;
      local_98.state_falling = local_58.state_falling;
      uVar3 = local_98._0_8_;
      local_98.low_start = local_58.low_start;
      local_98.state_rising = local_58.state_rising;
      bVar9 = local_98.state_rising == BIT_HIGH;
      local_98._0_8_ = uVar3;
      if (bVar9) {
        do {
          iVar7._M_current =
               (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<SWDBit,std::allocator<SWDBit>>::_M_realloc_insert<SWDBit_const&>
                      (pvVar4,iVar7,&local_98);
          }
          else {
            (iVar7._M_current)->low_end = local_58.low_end;
            (iVar7._M_current)->rising = local_58.rising;
            (iVar7._M_current)->falling = local_58.falling;
            (iVar7._M_current)->state_rising = local_58.state_rising;
            (iVar7._M_current)->state_falling = local_58.state_falling;
            (iVar7._M_current)->low_start = local_58.low_start;
            ppSVar1 = &(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppSVar1 = *ppSVar1 + 1;
          }
          ParseBit(&local_58,this);
          local_98.low_end = local_58.low_end;
          local_98.rising = local_58.rising;
          local_98.falling = local_58.falling;
          local_98.state_rising = local_58.state_rising;
          local_98.state_falling = local_58.state_falling;
          uVar3 = local_98._0_8_;
          local_98.low_start = local_58.low_start;
          local_98.state_rising = local_58.state_rising;
          bVar9 = local_98.state_rising == BIT_HIGH;
          local_98._0_8_ = uVar3;
        } while (bVar9);
      }
      std::vector<SWDBit,_std::allocator<SWDBit>_>::operator=
                (&local_60->bits,(vector<SWDBit,_std::allocator<SWDBit>_> *)pvVar4);
      pSVar2 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar7._M_current =
           (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current != pSVar2) {
        (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar2;
        iVar7._M_current = pSVar2;
      }
      if (iVar7._M_current ==
          (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SWDBit,std::allocator<SWDBit>>::_M_realloc_insert<SWDBit_const&>
                  (pvVar4,iVar7,&local_98);
      }
      else {
        (iVar7._M_current)->low_end = local_98.low_end;
        (iVar7._M_current)->rising = local_98.rising;
        (iVar7._M_current)->falling = local_98.falling;
        (iVar7._M_current)->state_rising = local_98.state_rising;
        (iVar7._M_current)->state_falling = local_98.state_falling;
        (iVar7._M_current)->low_start = local_98.low_start;
        ppSVar1 = &(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      return true;
    }
  }
  return bVar9;
}

Assistant:

bool SWDParser::IsLineReset( SWDLineReset& reset )
{
    reset.Clear();

    // we need at least 50 bits with a value of 1
    for( size_t cnt = 0; cnt < 50; cnt++ )
    {
        if( cnt >= mBitsBuffer.size() )
            mBitsBuffer.push_back( ParseBit() );

        // we can't have a low bit
        if( !mBitsBuffer[ cnt ].IsHigh() )
            return false;
    }

    SWDBit bit;
    while( true )
    {
        bit = ParseBit();
        if( !bit.IsHigh() )
            break;

        mBitsBuffer.push_back( bit );
    }

    // give the bits to the reset object
    reset.bits = mBitsBuffer;
    mBitsBuffer.clear();

    // keep the high bit because that one is probably next operation's start bit
    mBitsBuffer.push_back( bit );

    return true;
}